

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O2

void __thiscall gvr::PLYWriter::~PLYWriter(PLYWriter *this)

{
  pointer ppPVar1;
  PLYElement *this_00;
  size_t i;
  ulong uVar2;
  
  for (uVar2 = 0;
      ppPVar1 = (this->list).
                super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>._M_impl.
                super__Vector_impl_data._M_start,
      uVar2 < (ulong)((long)(this->list).
                            super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar1 >> 3);
      uVar2 = uVar2 + 1) {
    this_00 = ppPVar1[uVar2];
    if (this_00 != (PLYElement *)0x0) {
      PLYElement::~PLYElement(this_00);
    }
    operator_delete(this_00);
  }
  std::ofstream::~ofstream(&this->out);
  std::_Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>::~_Vector_base
            (&(this->list).super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>
            );
  return;
}

Assistant:

PLYWriter::~PLYWriter()
{
  for (size_t i=0; i<list.size(); i++)
  {
    delete list[i];
  }
}